

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O1

int __thiscall crnlib::fast_random::irand(fast_random *this,int l,int h)

{
  uint uVar1;
  uint uVar2;
  
  if (h - l != 0 && l <= h) {
    uVar2 = this->jsr << 0x11 ^ this->jsr;
    uVar2 = uVar2 >> 0xd ^ uVar2;
    uVar2 = uVar2 << 5 ^ uVar2;
    this->jsr = uVar2;
    uVar1 = this->jcong * 0x10dcd + 0x12d687;
    this->jcong = uVar1;
    l = (int)((ulong)(uVar1 ^ uVar2) * (ulong)(uint)(h - l) >> 0x20) + l;
  }
  return l;
}

Assistant:

int fast_random::irand(int l, int h)
    {
        CRNLIB_ASSERT(l < h);
        if (l >= h)
        {
            return l;
        }

        uint32 range = static_cast<uint32>(h - l);

        uint32 rnd = urand32();

#if defined(_M_IX86) && defined(_MSC_VER)
        //uint32 rnd_range = static_cast<uint32>(__emulu(range, rnd) >> 32U);
        uint32 x[2];
        *reinterpret_cast<uint64*>(x) = __emulu(range, rnd);
        uint32 rnd_range = x[1];
#else
        uint32 rnd_range = static_cast<uint32>((((uint64)range) * ((uint64)rnd)) >> 32U);
#endif

        int result = l + rnd_range;
        CRNLIB_ASSERT((result >= l) && (result < h));
        return result;
    }